

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ovf.cpp
# Opt level: O2

int ovf_close(ovf_file *ovf_file_ptr)

{
  parser_state *this;
  int iVar1;
  
  iVar1 = -2;
  if ((ovf_file_ptr != (ovf_file *)0x0) &&
     (this = ovf_file_ptr->_state, this != (parser_state *)0x0)) {
    parser_state::~parser_state(this);
    operator_delete(this);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int ovf_close(struct ovf_file * ovf_file_ptr)
try
{
    if( !ovf_file_ptr )
        return OVF_ERROR;
    if( !ovf_file_ptr->_state )
        return OVF_ERROR;
    delete(ovf_file_ptr->_state);
    return OVF_OK;
}
catch( ... )
{
    return OVF_ERROR;
}